

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O2

void __thiscall
Assimp::SpatialSort::FindPositions
          (SpatialSort *this,aiVector3D *pPosition,ai_real pRadius,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults)

{
  pointer puVar1;
  pointer pEVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ai_real *paVar7;
  uint uVar8;
  pointer pEVar9;
  float fVar10;
  float fVar11;
  aiVector3t<float> aVar12;
  
  fVar10 = ::operator*(pPosition,&this->mPlaneNormal);
  puVar1 = (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pEVar9 = (this->mPositions).
           super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->mPositions).
           super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = ((long)pEVar2 - (long)pEVar9) / 0x14;
  if (((pEVar2 != pEVar9) && (fVar11 = fVar10 + pRadius, pEVar9->mDistance <= fVar11)) &&
     (fVar10 = fVar10 - pRadius, fVar10 < pEVar2[-1].mDistance || fVar10 == pEVar2[-1].mDistance)) {
    uVar4 = uVar3 >> 1 & 0x7fffffff;
    uVar6 = uVar3 >> 2 & 0x3fffffff;
    while (uVar5 = (uint)uVar6, 1 < uVar5) {
      uVar8 = uVar5;
      if (fVar10 < pEVar9[uVar4].mDistance || fVar10 == pEVar9[uVar4].mDistance) {
        uVar8 = -uVar5;
      }
      uVar4 = (ulong)((int)uVar4 + uVar8);
      uVar6 = (ulong)(uVar5 >> 1);
    }
    paVar7 = &pEVar9[uVar4].mDistance;
    while (uVar4 != 0) {
      if (*paVar7 <= fVar10) goto LAB_003aa67e;
      paVar7 = paVar7 + -5;
      uVar4 = uVar4 - 1;
    }
    uVar4 = 0;
LAB_003aa67e:
    do {
      uVar6 = uVar4 & 0xffffffff;
      if (uVar3 - 1 <= uVar6) break;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (pEVar9[uVar6].mDistance <= fVar10 && fVar10 != pEVar9[uVar6].mDistance);
    pEVar9 = pEVar9 + uVar6;
    do {
      if (fVar11 < pEVar9->mDistance || fVar11 == pEVar9->mDistance) {
        return;
      }
      aVar12 = operator-(&pEVar9->mPosition,pPosition);
      if (aVar12.z * aVar12.z + aVar12.x * aVar12.x + aVar12.y * aVar12.y < pRadius * pRadius) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (poResults,&pEVar9->mIndex);
      }
      pEVar9 = pEVar9 + 1;
    } while (pEVar9 != (this->mPositions).
                       super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void SpatialSort::FindPositions( const aiVector3D& pPosition,
    ai_real pRadius, std::vector<unsigned int>& poResults) const
{
    const ai_real dist = pPosition * mPlaneNormal;
    const ai_real minDist = dist - pRadius, maxDist = dist + pRadius;

    // clear the array
    poResults.clear();

    // quick check for positions outside the range
    if( mPositions.size() == 0)
        return;
    if( maxDist < mPositions.front().mDistance)
        return;
    if( minDist > mPositions.back().mDistance)
        return;

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        if( mPositions[index].mDistance < minDist)
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && mPositions[index].mDistance > minDist)
        index--;
    while( index < (mPositions.size() - 1) && mPositions[index].mDistance < minDist)
        index++;

    // Mow start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the given radius to the result aray
    std::vector<Entry>::const_iterator it = mPositions.begin() + index;
    const ai_real pSquared = pRadius*pRadius;
    while( it->mDistance < maxDist)
    {
        if( (it->mPosition - pPosition).SquareLength() < pSquared)
            poResults.push_back( it->mIndex);
        ++it;
        if( it == mPositions.end())
            break;
    }

    // that's it
}